

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  size_t __size;
  int iVar2;
  int iVar3;
  j1939cat_priv *priv;
  ulong uVar4;
  uint8_t *buf;
  int *piVar5;
  __off_t _Var6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  sockaddr_can *__nbytes;
  char *pcVar10;
  char *pcVar11;
  byte bVar12;
  size_t _min2;
  sockaddr_can *psVar13;
  bool bVar14;
  bool bVar15;
  ulong uStack_90;
  uint sock_opt;
  undefined4 local_7c;
  int *local_78;
  sockaddr_can *local_70;
  int local_64;
  sockaddr_can *local_60;
  int local_58;
  int local_54;
  sockaddr_can *local_50;
  size_t _min1;
  ulong local_40;
  undefined4 local_34;
  
  priv = (j1939cat_priv *)calloc(1,0xb0);
  if (priv == (j1939cat_priv *)0x0) {
    pcVar11 = "can\'t allocate priv";
  }
  else {
    priv->todo_prio = -1;
    piVar5 = &priv->todo_prio;
    priv->outfile = 1;
    priv->max_transfer = 0x6fffff9;
    priv->polltimeout = 100000;
    priv->repeat = 1;
    local_70 = &priv->sockname;
    (priv->sockname).can_family = 0x1d;
    (priv->sockname).can_addr.j1939.addr = 0xff;
    (priv->sockname).can_addr.j1939.pgn = 0x40000;
    local_60 = &priv->peername;
    (priv->peername).can_family = 0x1d;
    (priv->peername).can_addr.j1939.addr = 0xff;
    (priv->peername).can_addr.j1939.pgn = 0x40000;
    local_78 = &priv->todo_broadcast;
    do {
      while( true ) {
        while( true ) {
          while (iVar2 = getopt(argc,argv,"?hi:vs:rp:P:R:B"), iVar2 == 0x42) {
            *local_78 = 1;
          }
          if (iVar2 != 0x50) break;
          uVar4 = strtoul(_optarg,(char **)0x0,0);
          priv->polltimeout = uVar4;
        }
        if (iVar2 == 0x52) break;
        if (iVar2 == 99) {
          priv->todo_connect = true;
        }
        else if (iVar2 == 0x69) {
          iVar2 = open(_optarg,0);
          priv->infile = iVar2;
          if (iVar2 == -1) {
            pcVar11 = "can\'t open input file";
            goto LAB_00102b4c;
          }
          priv->todo_filesize = true;
        }
        else if (iVar2 == 0x70) {
          uVar4 = strtoul(_optarg,(char **)0x0,0);
          *piVar5 = (int)uVar4;
        }
        else if (iVar2 == 0x72) {
          priv->todo_recv = true;
        }
        else {
          if (iVar2 != 0x73) {
            if (iVar2 != -1) {
              fputs("j1939cat: netcat-like tool for j1939\nUsage: j1939cat [options] FROM TO\n FROM / TO\t- or [IFACE][:[SA][,[PGN][,NAME]]]\nOptions:\n -i <infile>\t(default stdin)\n -s <size>\tSet maximal transfer size. Default: 117440505 byte\n -r\t\tReceive data\n -P <timeout>  poll timeout in milliseconds before sending data.\n\t\tWith this option send() will be used with MSG_DONTWAIT flag.\n -R <count>\tSet send repeat count. Default: 1\n -B\t\tAllow to send and receive broadcast packets.\n\nExample:\nj1939cat -i some_file_to_send  can0:0x80 :0x90,0x12300\nj1939cat can0:0x90 -r > /tmp/some_file_to_receive\n\n"
                    ,_stderr);
              return 1;
            }
            pbVar1 = (byte *)argv[_optind];
            if (pbVar1 != (byte *)0x0) {
              uVar8 = *pbVar1 - 0x2d;
              if (uVar8 == 0) {
                uVar8 = (uint)pbVar1[1];
              }
              iVar2 = _optind;
              if (uVar8 != 0) {
                libj1939_parse_canaddr((char *)pbVar1,local_70);
                iVar2 = _optind;
              }
              _optind = iVar2 + 1;
              pbVar1 = (byte *)argv[(long)iVar2 + 1];
              if (pbVar1 != (byte *)0x0) {
                uVar8 = *pbVar1 - 0x2d;
                if (uVar8 == 0) {
                  uVar8 = (uint)pbVar1[1];
                }
                if (uVar8 != 0) {
                  libj1939_parse_canaddr((char *)pbVar1,local_60);
                  priv->valid_peername = true;
                }
                _optind = _optind + 1;
              }
            }
            iVar2 = socket(0x1d,2,7);
            priv->sock = iVar2;
            if (iVar2 < 0) {
              pcVar11 = "socket(j1939)";
            }
            else {
              if (-1 < *piVar5) {
                iVar2 = setsockopt(iVar2,0x6b,3,piVar5,4);
                if (iVar2 < 0) {
                  warn("set priority %i",*piVar5);
                  return 1;
                }
                iVar2 = priv->sock;
              }
              local_34 = 1;
              iVar2 = setsockopt(iVar2,0x6b,4,&local_34,4);
              if (iVar2 < 0) {
                pcVar11 = "set recverr";
              }
              else {
                sock_opt = 0x1f98;
                iVar2 = 1;
                iVar3 = setsockopt(priv->sock,1,0x25,&sock_opt,4);
                if (iVar3 != 0) {
                  pcVar11 = "setsockopt timestamping";
                  goto LAB_00102b4c;
                }
                if ((*local_78 == 0) || (iVar3 = setsockopt(priv->sock,1,6,local_78,4), -1 < iVar3))
                {
                  iVar3 = bind(priv->sock,(sockaddr *)local_70,0x18);
                  if (-1 < iVar3) {
                    if (priv->todo_connect == true) {
                      if (priv->valid_peername == false) {
                        pcVar11 = "no peername supplied";
                        goto LAB_00102ab5;
                      }
                      iVar3 = connect(priv->sock,(sockaddr *)local_60,0x18);
                      if (iVar3 < 0) {
                        pcVar11 = "connect()";
                        goto LAB_00102ab5;
                      }
                    }
                    if (priv->todo_recv == true) {
                      __size = priv->max_transfer;
                      buf = (uint8_t *)malloc(__size);
                      if (buf != (uint8_t *)0x0) {
                        priv->last_dpo = -1;
                        bVar12 = 1;
                        goto LAB_001026bd;
                      }
                      warn("can\'t allocate rx buf");
                      goto LAB_00102b07;
                    }
                    if (priv->todo_filesize != true) goto LAB_00102b07;
                    iVar3 = priv->infile;
                    local_50 = (sockaddr_can *)lseek(iVar3,0,2);
                    if (local_50 == (sockaddr_can *)0xffffffffffffffff) {
                      pcVar11 = "%s lseek()\n";
                    }
                    else {
                      _Var6 = lseek(iVar3,0,0);
                      if (_Var6 != -1) {
                        local_50 = (sockaddr_can *)((ulong)local_50 & 0xffffffff);
                        if (local_50 == (sockaddr_can *)0x0) goto LAB_00102b07;
                        uVar4 = 0;
                        goto LAB_00102815;
                      }
                      pcVar11 = "%s lseek() start\n";
                    }
                    pcVar10 = "j1939cat_get_file_size";
                    goto LAB_00102b7f;
                  }
                  pcVar11 = "bind()";
                }
                else {
                  pcVar11 = "setsockopt: filed to set broadcast";
                }
              }
            }
LAB_00102ab5:
            warn(pcVar11);
            return 1;
          }
          uVar4 = strtoul(_optarg,(char **)0x0,0);
          priv->max_transfer = uVar4;
          if (0x6fffff9 < uVar4) {
            err(1,"used value (%zu) is bigger then allowed maximal size: %u.\n",uVar4,0x6fffff9);
          }
        }
      }
      uVar4 = strtoul(_optarg,(char **)0x0,0);
      priv->repeat = uVar4;
    } while (uVar4 != 0);
    pcVar11 = "send/repeat count can\'t be less then 1\n";
  }
LAB_00102b4c:
  err(1,pcVar11);
LAB_001026bd:
  if ((bVar12 & 1) == 0) goto LAB_00102aa1;
  if (priv->polltimeout == 0) {
    iVar3 = j1939cat_recv_one(priv,buf,__size);
    iVar2 = 1;
    if (iVar3 != 0) goto LAB_00102aa4;
  }
  else {
    sock_opt = priv->sock;
    local_7c = 9;
    iVar2 = poll((pollfd *)&sock_opt,1,(int)priv->polltimeout);
    if (iVar2 != 0) {
      if (iVar2 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != -4) {
          iVar2 = -*piVar5;
          goto LAB_00102b07;
        }
      }
      else {
        if (((int)(short)local_7c._2_2_ & 9U) == 0) {
          warn("%s: something else is wrong %x %x","j1939cat_recv",(int)(short)local_7c._2_2_,9);
          iVar2 = -5;
          goto LAB_00102b07;
        }
        if ((local_7c & 0x80000) != 0) {
          iVar2 = j1939cat_recv_err(priv);
          if (iVar2 == -4) goto LAB_0010271b;
          if (iVar2 != 0) goto LAB_00102b07;
        }
        if ((local_7c._2_2_ & 1) != 0) {
          j1939cat_recv_one(priv,buf,__size);
        }
      }
    }
  }
LAB_0010271b:
  bVar12 = priv->todo_recv;
  goto LAB_001026bd;
LAB_00102815:
  psVar13 = local_50;
  if (priv->repeat <= uVar4) {
    iVar2 = 0;
    goto LAB_00102b07;
  }
  priv->round = priv->round + 1;
  local_64 = priv->sock;
  local_54 = priv->infile;
  _min1 = priv->max_transfer;
  if (local_50 <= (sockaddr_can *)priv->max_transfer) {
    _min1 = (size_t)local_50;
  }
  local_58 = (int)uVar4;
  local_70 = (sockaddr_can *)malloc(_min1);
  if (local_70 == (sockaddr_can *)0x0) {
    warn("can\'t allocate buf");
    iVar2 = 1;
    goto LAB_00102b07;
  }
  while (iVar2 = 0, psVar13 != (sockaddr_can *)0x0) {
    __nbytes = psVar13;
    if (_min1 < psVar13) {
      __nbytes = (sockaddr_can *)_min1;
    }
    piVar5 = (int *)read(local_54,local_70,(size_t)__nbytes);
    if (piVar5 == (int *)0xffffffffffffffff) {
      iVar2 = 1;
      break;
    }
    local_60 = psVar13;
    if (piVar5 == (int *)0x0) break;
    local_40 = (long)piVar5 + (long)local_70;
    bVar14 = false;
    uVar8 = 0xc;
    psVar13 = local_70;
    local_78 = piVar5;
    while (!bVar14) {
      do {
        while( true ) {
          if (priv->polltimeout == 0) {
            uStack_90 = j1939cat_send_one(priv,local_64,psVar13,(size_t)piVar5);
            if ((long)uStack_90 < 0) goto LAB_00102a10;
            bVar14 = false;
            goto LAB_001029ab;
          }
          sock_opt = priv->sock;
          local_7c = uVar8;
          iVar2 = poll((pollfd *)&sock_opt,1,(int)priv->polltimeout);
          if (iVar2 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != -4) {
            uStack_90 = (ulong)(uint)-*piVar7;
            goto LAB_00102a10;
          }
        }
        if (iVar2 == 0) {
          uStack_90 = 0xffffffffffffffc2;
LAB_00102a0c:
          uStack_90 = uStack_90 & 0xffffffff;
          goto LAB_00102a10;
        }
        uVar9 = (uint)(short)local_7c._2_2_;
        if ((uVar8 & uVar9) == 0) {
          warn("%s: something else is wrong %x %x","j1939cat_send_loop",uVar9,uVar8);
          uStack_90 = 0xfffffffffffffffb;
          goto LAB_00102a0c;
        }
        if ((uVar9 & 8) == 0) {
          bVar14 = false;
          goto LAB_00102988;
        }
        uVar9 = j1939cat_recv_err(priv);
      } while (uVar9 == 0xfffffffc);
      uStack_90 = (ulong)uVar9;
      if (uVar9 != 0) {
LAB_00102a10:
        iVar2 = (int)uStack_90;
        if (iVar2 != 0) goto LAB_00102a46;
        break;
      }
      bVar14 = priv->repeat - 1 == (ulong)(priv->stats).tskey;
LAB_00102988:
      if ((local_7c._2_2_ & 4) == 0) {
        uStack_90 = 0;
      }
      else {
        uStack_90 = j1939cat_send_one(priv,local_64,psVar13,(size_t)piVar5);
        if ((long)uStack_90 < 0) goto LAB_00102a10;
      }
LAB_001029ab:
      if (local_40 < (ulong)((long)&psVar13->can_family + (long)piVar5)) {
        warn("%s: send buffer is bigger than the read buffer");
        iVar2 = -0x16;
        goto LAB_00102a46;
      }
      psVar13 = (sockaddr_can *)((long)&psVar13->can_family + uStack_90);
      piVar5 = (int *)((long)piVar5 - uStack_90);
      if (piVar5 == (int *)0x0) {
        bVar15 = priv->repeat != priv->round;
        if (!bVar15) {
          uVar8 = 8;
        }
        bVar14 = (bool)(bVar15 | bVar14);
        piVar5 = (int *)0x0;
      }
    }
    psVar13 = (sockaddr_can *)((long)local_60 - (long)local_78);
  }
LAB_00102a46:
  free(local_70);
  if (iVar2 != 0) goto LAB_00102b07;
  _Var6 = lseek(priv->infile,0,0);
  uVar4 = (ulong)(local_58 + 1);
  if (_Var6 == -1) {
    pcVar11 = "%s lseek() start\n";
    pcVar10 = "j1939cat_send";
LAB_00102b7f:
    err(1,pcVar11,pcVar10);
  }
  goto LAB_00102815;
LAB_00102aa1:
  iVar2 = 0;
LAB_00102aa4:
  free(buf);
LAB_00102b07:
  close(priv->infile);
  close(priv->outfile);
  close(priv->sock);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939cat_priv *priv;
	int ret = 0;

	priv = calloc(1, sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	priv->todo_prio = -1;
	priv->infile = STDIN_FILENO;
	priv->outfile = STDOUT_FILENO;
	priv->max_transfer = J1939_MAX_ETP_PACKET_SIZE;
	priv->polltimeout = 100000;
	priv->repeat = 1;

	j1939cat_init_sockaddr_can(&priv->sockname);
	j1939cat_init_sockaddr_can(&priv->peername);

	ret = j1939cat_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	ret = j1939cat_sock_prepare(priv);
	if (ret)
		return ret;

	if (priv->todo_recv)
		ret = j1939cat_recv(priv);
	else
		ret = j1939cat_send(priv);

	close(priv->infile);
	close(priv->outfile);
	close(priv->sock);

	return ret;
}